

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesDriverGet(uint32_t *pCount,zes_driver_handle_t *phDrivers)

{
  zes_driver_handle_t p_Var1;
  bool bVar2;
  ulong local_30;
  size_t i;
  zes_pfnDriverGet_t pfnGet;
  ze_result_t result;
  zes_driver_handle_t *phDrivers_local;
  uint32_t *pCount_local;
  
  pfnGet._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cb10 == (code *)0x0) {
    local_30 = 0;
    while( true ) {
      bVar2 = false;
      if (phDrivers != (zes_driver_handle_t *)0x0) {
        bVar2 = local_30 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (zes_driver_handle_t)context_t::get((context_t *)&context);
      phDrivers[local_30] = p_Var1;
      local_30 = local_30 + 1;
    }
  }
  else {
    pfnGet._4_4_ = (*DAT_0011cb10)(pCount,phDrivers);
  }
  return pfnGet._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGet(
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sysman driver instances.
                                                        ///< if count is zero, then the loader shall update the value with the
                                                        ///< total number of sysman drivers available.
                                                        ///< if count is greater than the number of sysman drivers available, then
                                                        ///< the loader shall update the value with the correct number of sysman
                                                        ///< drivers available.
        zes_driver_handle_t* phDrivers                  ///< [in,out][optional][range(0, *pCount)] array of sysman driver instance handles.
                                                        ///< if count is less than the number of sysman drivers available, then the
                                                        ///< loader shall only retrieve that number of sysman drivers.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGet = context.zesDdiTable.Driver.pfnGet;
        if( nullptr != pfnGet )
        {
            result = pfnGet( pCount, phDrivers );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phDrivers ) && ( i < *pCount ); ++i )
                phDrivers[ i ] = reinterpret_cast<zes_driver_handle_t>( context.get() );

        }

        return result;
    }